

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarCommon.h
# Opt level: O0

float ZXing::OneD::DataBar::ModSizeFinder(PatternView *view)

{
  int iVar1;
  undefined8 in_RDI;
  PatternView *unaff_retaddr;
  PatternView *in_stack_ffffffffffffffe0;
  
  iVar1 = (int)((ulong)in_RDI >> 0x20);
  Finder(in_stack_ffffffffffffffe0);
  iVar1 = PatternView::sum(unaff_retaddr,iVar1);
  return (float)iVar1 / 15.0;
}

Assistant:

inline float ModSizeFinder(const PatternView& view)
{
	return Finder(view).sum() / 15.f;
}